

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O1

cupdlp_int getCupdlpLogLevel(HighsOptions *options)

{
  cupdlp_int cVar1;
  
  cVar1 = 0;
  if ((options->super_HighsOptionsStruct).output_flag != false) {
    cVar1 = 2 - (uint)((options->super_HighsOptionsStruct).log_dev_level == 0);
  }
  return cVar1;
}

Assistant:

cupdlp_int getCupdlpLogLevel(const HighsOptions& options) {
  if (options.output_flag) {
    if (options.log_dev_level) {
      return 2;
    } else {
      return 1;
    }
  }
  return 0;
}